

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLMaterialLoader.cpp
# Opt level: O2

void __thiscall
Assimp::MDLImporter::SkipSkinLump_3DGS_MDL7
          (MDLImporter *this,uchar *szCurrent,uchar **szCurrentOut,uint iType,uint iWidth,
          uint iHeight)

{
  ulong uVar1;
  size_t sVar2;
  int *piVar3;
  int *szData;
  uint iType_00;
  uint iSkip;
  uint local_464;
  uchar **local_460;
  aiTexture local_458;
  
  iType_00 = iType & 0xf;
  uVar1 = 0;
  if (iType_00 == 6) {
    uVar1 = (ulong)iWidth;
  }
  if (iType_00 == 7) {
    sVar2 = strlen((char *)szCurrent);
    szData = (int *)(szCurrent + sVar2 + 1);
  }
  else {
    szData = (int *)(szCurrent + uVar1);
    if (iType == 0 || iType_00 != 0) {
      iSkip = 0;
      local_458.mFilename.length = 0;
      local_458.mFilename.data[0] = '\0';
      local_464 = iHeight;
      local_460 = szCurrentOut;
      memset(local_458.mFilename.data + 1,0x1b,0x3ff);
      local_458.achFormatHint[0] = '\0';
      local_458.achFormatHint[1] = '\0';
      local_458.achFormatHint[2] = '\0';
      local_458.achFormatHint[3] = '\0';
      local_458.pcData = (aiTexel *)0xffffffffffffffff;
      local_458.mHeight = local_464;
      local_458.mWidth = iWidth;
      ParseTextureColorData(this,(uchar *)szData,iType_00,&iSkip,&local_458);
      local_458.pcData = (aiTexel *)0x0;
      szData = (int *)((long)szData + (ulong)iSkip);
      aiTexture::~aiTexture(&local_458);
      szCurrentOut = local_460;
    }
  }
  piVar3 = szData + 0x11;
  if ((iType & 0x10) == 0) {
    piVar3 = szData;
  }
  if ((iType & 0x20) != 0) {
    piVar3 = (int *)((long)piVar3 + (long)*piVar3 + 4);
  }
  *szCurrentOut = (uchar *)piVar3;
  return;
}

Assistant:

void MDLImporter::SkipSkinLump_3DGS_MDL7(
    const unsigned char* szCurrent,
    const unsigned char** szCurrentOut,
    unsigned int iType,
    unsigned int iWidth,
    unsigned int iHeight)
{
    // get the type of the skin
    const unsigned int iMasked = (unsigned int)(iType & 0xF);

    if (0x6 == iMasked)
    {
        szCurrent += iWidth;
    }
    if (0x7 == iMasked)
    {
        const size_t iLen = ::strlen((const char*)szCurrent);
        szCurrent += iLen+1;
    }
    else if (iMasked || !iType)
    {
        if (iMasked || !iType || (iType && iWidth && iHeight))
        {
            // ParseTextureColorData(..., aiTexture::pcData == bad_texel) will simply
            // return the size of the color data in bytes in iSkip
            unsigned int iSkip = 0;

            aiTexture tex;
            tex.pcData = bad_texel;
            tex.mHeight = iHeight;
            tex.mWidth = iWidth;
            ParseTextureColorData(szCurrent,iMasked,&iSkip,&tex);

            // FIX: Important, otherwise the destructor will crash
            tex.pcData = NULL;

            // skip length of texture data
            szCurrent += iSkip;
        }
    }

    // check whether a material definition is contained in the skin
    if (iType & AI_MDL7_SKINTYPE_MATERIAL)
    {
        BE_NCONST MDL::Material_MDL7* pcMatIn = (BE_NCONST MDL::Material_MDL7*)szCurrent;
        szCurrent = (unsigned char*)(pcMatIn+1);
    }

    // if an ASCII effect description (HLSL?) is contained in the file,
    // we can simply ignore it ...
    if (iType & AI_MDL7_SKINTYPE_MATERIAL_ASCDEF)
    {
        int32_t iMe = *((int32_t*)szCurrent);
        AI_SWAP4(iMe);
        szCurrent += sizeof(char) * iMe + sizeof(int32_t);
    }
    *szCurrentOut = szCurrent;
}